

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

GLenum gl4cts::CopyImage::Utils::transRealToBindTarget(GLenum target)

{
  GLenum GVar1;
  
  GVar1 = 0x8513;
  if (5 < target - 0x8515) {
    GVar1 = target;
  }
  return GVar1;
}

Assistant:

GLenum Utils::transRealToBindTarget(GLenum target)
{
	switch (target)
	{
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_X:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Y:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_NEGATIVE_Z:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_POSITIVE_X:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Y:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	case GL_TEXTURE_CUBE_MAP_POSITIVE_Z:
		target = GL_TEXTURE_CUBE_MAP;
		break;
	default:
		break;
	}

	return target;
}